

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall demo::Logging::LogLine::LogLine(LogLine *this)

{
  Logging *pLVar1;
  ulong uVar2;
  LogLine *this_00;
  undefined8 *in_RDI;
  string context;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff88;
  LogLine *in_stack_ffffffffffffff90;
  string local_58 [48];
  string local_28 [40];
  
  pLVar1 = capture_thread::ThreadCapture<demo::Logging>::GetCurrent();
  *in_RDI = pLVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(in_RDI + 1));
  Tracing::GetContext_abi_cxx11_();
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string(local_58,local_28);
    this_00 = operator<<(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    operator<<(this_00,(char *)in_stack_ffffffffffffff88);
    std::__cxx11::string::~string(local_58);
  }
  else {
    operator<<(in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88);
  }
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

Logging::LogLine::LogLine() : capture_(GetCurrent()) {
  const std::string context = Tracing::GetContext();
  if (!context.empty()) {
    *this << context << ": ";
  } else {
    *this << "(unknown context): ";
  }
}